

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O0

void __thiscall
merlin::cte::joint_marginal
          (cte *this,variable_set *scope,vector<int,_std::allocator<int>_> *evidence)

{
  edge *peVar1;
  value v_00;
  double B;
  const_iterator ci;
  bool bVar2;
  bool bVar3;
  node *pnVar4;
  reference pvVar5;
  reference ppeVar6;
  variable *this_00;
  reference pvVar7;
  ostream *poVar8;
  variable_set *pvVar9;
  size_t sVar10;
  size_t sVar11;
  variable vVar12;
  double v;
  size_t j_1;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  size_t i_1;
  config_index cv2;
  index_config cv1;
  variable local_200;
  variable local_1f0;
  const_iterator local_1e0;
  undefined1 local_1c0 [8];
  const_iterator vi;
  variable_set v_rem;
  edge *e;
  __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
  local_158;
  iterator ei;
  node *n;
  int local_88;
  undefined1 local_78 [8];
  variable_set temp;
  node *cl;
  size_t i;
  size_t j;
  bool found;
  vector<int,_std::allocator<int>_> *evidence_local;
  variable_set *scope_local;
  cte *this_local;
  
  bVar3 = false;
  i = 0;
  for (cl = (node *)0x0;
      pnVar4 = (node *)std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::
                       size(&this->m_clusters), cl < pnVar4; cl = (node *)((long)&cl->id + 1)) {
    temp.m_d = &std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::operator[]
                          (&this->m_clusters,(size_type)cl)->id;
    variable_set::operator&((variable_set *)local_78,&((reference)temp.m_d)->clique,scope);
    bVar2 = variable_set::operator==((variable_set *)local_78,scope);
    if (bVar2) {
      bVar3 = true;
      i = (size_t)cl;
      local_88 = 2;
    }
    else {
      local_88 = 0;
    }
    variable_set::~variable_set((variable_set *)local_78);
    if (local_88 != 0) break;
  }
  if (!bVar3) {
    __assert_fail("found",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/cte.cpp"
                  ,0x30d,
                  "void merlin::cte::joint_marginal(const variable_set &, std::vector<int> &)");
  }
  factor::factor((factor *)&n,scope,0.0);
  factor::operator=(&this->m_marginal,(factor *)&n);
  factor::~factor((factor *)&n);
  pvVar5 = std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::operator[]
                     (&this->m_clusters,i);
  factor::condition((factor *)&ei,&pvVar5->theta,evidence);
  factor::operator=(&pvVar5->belief,(factor *)&ei);
  factor::~factor((factor *)&ei);
  local_158._M_current =
       (edge **)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::begin
                          (&pvVar5->edges);
  while( true ) {
    e = (edge *)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::end
                          (&pvVar5->edges);
    bVar3 = __gnu_cxx::operator!=
                      (&local_158,
                       (__normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
                        *)&e);
    if (!bVar3) break;
    ppeVar6 = __gnu_cxx::
              __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
              ::operator*(&local_158);
    peVar1 = *ppeVar6;
    if (peVar1->second->id == pvVar5->id) {
      factor::operator*=(&pvVar5->belief,&peVar1->fwd);
    }
    if (peVar1->first->id == pvVar5->id) {
      factor::operator*=(&pvVar5->belief,&peVar1->bwd);
    }
    __gnu_cxx::
    __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
    ::operator++(&local_158);
  }
  variable_set::variable_set((variable_set *)&vi.m_tmp.m_states);
  variable_set::begin((const_iterator *)local_1c0,&pvVar5->clique);
  while( true ) {
    variable_set::end(&local_1e0,&pvVar5->clique);
    ci.m_vs = local_1e0.m_vs;
    ci.m_i = local_1e0.m_i;
    ci.m_tmp.m_label = local_1e0.m_tmp.m_label;
    ci.m_tmp.m_states = local_1e0.m_tmp.m_states;
    bVar3 = variable_set::const_iterator::operator!=((const_iterator *)local_1c0,ci);
    if (!bVar3) break;
    vVar12 = variable_set::const_iterator::operator*((const_iterator *)local_1c0);
    local_1f0 = vVar12;
    bVar2 = variable_set::contains(scope,&local_1f0);
    bVar3 = false;
    if (!bVar2) {
      this_00 = variable_set::const_iterator::operator->((const_iterator *)local_1c0);
      sVar11 = variable::label(this_00);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](evidence,sVar11);
      bVar3 = *pvVar7 < 0;
    }
    if (bVar3) {
      vVar12 = variable_set::const_iterator::operator*((const_iterator *)local_1c0);
      local_200 = vVar12;
      variable_set::operator|=((variable_set *)&vi.m_tmp.m_states,&local_200);
    }
    variable_set::const_iterator::operator++((const_iterator *)local_1c0);
  }
  factor::sum((factor *)
              &cv1.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar5->belief,
              (variable_set *)&vi.m_tmp.m_states);
  factor::operator=(&pvVar5->belief,
                    (factor *)
                    &cv1.m_vars.
                     super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
  factor::~factor((factor *)
                  &cv1.m_vars.
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  if ((this->m_debug & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] Joint marginal scope: ");
    pvVar9 = factor::vars(&this->m_marginal);
    poVar8 = merlin::operator<<(poVar8,pvVar9);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] Actual belief scope:  ");
    poVar8 = merlin::operator<<(poVar8,&pvVar5->belief);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  pvVar9 = factor::vars(&this->m_marginal);
  index_config::index_config
            ((index_config *)
             &cv2.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9,true);
  pvVar9 = factor::vars(&pvVar5->belief);
  config_index::config_index((config_index *)&i_1,pvVar9,true);
  config._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    sVar11 = config._M_t._M_impl.super__Rb_tree_header._M_node_count;
    sVar10 = factor::num_states(&this->m_marginal);
    if (sVar10 <= sVar11) break;
    index_config::convert
              ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)&j_1,(index_config *)
                       &cv2.m_vars.
                        super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
               config._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar3 = is_compatible(this,(map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&j_1,evidence);
    if (bVar3) {
      sVar11 = config_index::convert
                         ((config_index *)&i_1,
                          (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)&j_1);
      v_00 = factor::get(&pvVar5->belief,sVar11);
      factor::set(&this->m_marginal,config._M_t._M_impl.super__Rb_tree_header._M_node_count,v_00);
    }
    else {
      factor::set(&this->m_marginal,config._M_t._M_impl.super__Rb_tree_header._M_node_count,0.0);
    }
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)&j_1);
    config._M_t._M_impl.super__Rb_tree_header._M_node_count =
         config._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  B = exp(this->m_logz);
  factor::operator/=(&this->m_marginal,B);
  if ((this->m_debug & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] Joint marginal: ");
    poVar8 = merlin::operator<<(poVar8,&this->m_marginal);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  config_index::~config_index((config_index *)&i_1);
  index_config::~index_config
            ((index_config *)
             &cv2.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  variable_set::~variable_set((variable_set *)&vi.m_tmp.m_states);
  return;
}

Assistant:

void cte::joint_marginal(const variable_set& scope, std::vector<int>& evidence) {

	// Get the cluster that contains the scope
	bool found = false;
	size_t j = 0;
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		variable_set temp = (cl.clique & scope);
		if (temp == scope) {
			found = true;
			j = i;
			break;
		}
	}

	// Safety check
	assert(found);

	// Compute the joint marginal (belief) subject to evidence
	m_marginal = factor(scope, 0.0);
	detail::node& n = m_clusters[j];
	n.belief = n.theta.condition(evidence);
	for (std::vector<detail::edge*>::iterator ei = n.edges.begin();
			ei != n.edges.end(); ++ei) {
		detail::edge* e = (*ei);
		if (e->second->id == n.id) {
			n.belief *= e->fwd;
		}
		if (e->first->id == n.id) {
			n.belief *= e->bwd;
		}
	}

	// Update the belief entries subject to evidence
	variable_set v_rem;
	for (variable_set::const_iterator vi = n.clique.begin();
			vi != n.clique.end(); ++vi) {
		if (!scope.contains(*vi) && evidence[vi->label()] < 0) {
			v_rem |= *vi;
		}
	}
	n.belief = n.belief.sum(v_rem);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal scope: " << m_marginal.vars() << std::endl;
		std::cout << "[DEBUG] Actual belief scope:  " << n.belief << std::endl;
	}

	// Fill in all configurations of the marginal (including the evidence)
	index_config cv1(m_marginal.vars(), true);
	config_index cv2(n.belief.vars(), true);
	for (size_t i = 0; i < m_marginal.num_states(); ++i) {
		std::map<size_t, size_t> config = cv1.convert(i);
		if (is_compatible(config, evidence)) {
			size_t j = cv2.convert(config);
			double v = n.belief.get(j);
			m_marginal.set(i, v);
		} else {
			m_marginal.set(i, 0.0);
		}
	}

	// Normalize by P(evidence)
	m_marginal /= std::exp(m_logz);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal: " << m_marginal << std::endl;
	}
}